

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O1

void __thiscall nv::ColorBlock::boundsRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  byte bVar1;
  anon_union_4_2_12391d8d_for_Color32_0 aVar2;
  byte bVar3;
  anon_union_4_2_12391d8d_for_Color32_0 aVar4;
  byte bVar5;
  anon_union_4_2_12391d8d_for_Color32_0 aVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  byte bVar14;
  uint i;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  
  bVar12 = 0xff;
  lVar16 = 0;
  bVar10 = 0xff;
  aVar4.u = 0xff;
  bVar7 = 0;
  aVar6.u = 0;
  bVar14 = 0;
  do {
    bVar5 = this->m_color[lVar16].field_0.field_0.r;
    if (bVar5 < bVar12) {
      bVar12 = bVar5;
    }
    bVar1 = this->m_color[lVar16].field_0.field_0.g;
    if (bVar1 < bVar10) {
      bVar10 = bVar1;
    }
    aVar2 = (anon_union_4_2_12391d8d_for_Color32_0)
            *(anon_union_4_2_12391d8d_for_Color32_0 *)&this->m_color[lVar16].field_0.field_0;
    bVar3 = aVar4.field_0.b;
    aVar4.u = aVar4.u & 0xff;
    if (aVar2._0_1_ < bVar3) {
      aVar4 = aVar2;
    }
    if (bVar7 < bVar5) {
      bVar7 = bVar5;
    }
    if (bVar14 < bVar1) {
      bVar14 = bVar1;
    }
    bVar5 = aVar6.field_0.b;
    aVar6.u = aVar6.u & 0xff;
    if (bVar5 < aVar2._0_1_) {
      aVar6 = aVar2;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x10);
  uVar13 = ((uint)bVar7 - (uint)bVar12 & 0xffff) >> 4;
  uVar11 = ((uint)bVar14 - (uint)bVar10 & 0xffff) >> 4;
  uVar8 = ((aVar6.u & 0xff) - (aVar4.u & 0xff) & 0xffff) >> 4;
  uVar15 = (uVar13 & 0xff) + (uint)bVar12;
  if (0xfe < uVar15) {
    uVar15 = 0xff;
  }
  uVar9 = (uVar11 & 0xff) + (uint)bVar10;
  if (0xfe < uVar9) {
    uVar9 = 0xff;
  }
  uVar17 = (uVar8 & 0xff) + (aVar4.u & 0xff);
  if (0xfe < uVar17) {
    uVar17 = 0xff;
  }
  uVar18 = 0;
  bVar12 = (byte)uVar13;
  uVar13 = (uint)(byte)(bVar7 - bVar12);
  if (bVar7 < bVar12) {
    uVar13 = uVar18;
  }
  bVar7 = (byte)uVar11;
  uVar11 = (uint)(byte)(bVar14 - bVar7);
  if (bVar14 < bVar7) {
    uVar11 = uVar18;
  }
  bVar7 = (byte)uVar8;
  uVar8 = (uint)(byte)(aVar6.field_0.b - bVar7);
  if (aVar6.field_0.b < bVar7) {
    uVar8 = uVar18;
  }
  (start->field_0).u = uVar17 | 0xff000000 | uVar9 << 8 | uVar15 << 0x10;
  (end->field_0).u = uVar8 | uVar11 << 8 | uVar13 << 0x10 | 0xff000000;
  return;
}

Assistant:

void ColorBlock::boundsRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);

	Color32 minColor(255, 255, 255);
	Color32 maxColor(0, 0, 0);

	for(uint i = 0; i < 16; i++)
	{
		if (m_color[i].r < minColor.r) { minColor.r = m_color[i].r; }
		if (m_color[i].g < minColor.g) { minColor.g = m_color[i].g; }
		if (m_color[i].b < minColor.b) { minColor.b = m_color[i].b; }
		if (m_color[i].r > maxColor.r) { maxColor.r = m_color[i].r; }
		if (m_color[i].g > maxColor.g) { maxColor.g = m_color[i].g; }
		if (m_color[i].b > maxColor.b) { maxColor.b = m_color[i].b; }
	}

	// Offset range by 1/16 of the extents
	Color32 inset;
	inset.r = (maxColor.r - minColor.r) >> 4;
	inset.g = (maxColor.g - minColor.g) >> 4;
	inset.b = (maxColor.b - minColor.b) >> 4;

	minColor.r = (minColor.r + inset.r <= 255) ? minColor.r + inset.r : 255;
	minColor.g = (minColor.g + inset.g <= 255) ? minColor.g + inset.g : 255;
	minColor.b = (minColor.b + inset.b <= 255) ? minColor.b + inset.b : 255;

	maxColor.r = (maxColor.r >= inset.r) ? maxColor.r - inset.r : 0;
	maxColor.g = (maxColor.g >= inset.g) ? maxColor.g - inset.g : 0;
	maxColor.b = (maxColor.b >= inset.b) ? maxColor.b - inset.b : 0;

	*start = minColor;
	*end = maxColor;
}